

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O0

void advance_engine<trng::mrg3s>(mrg3s *r1,mrg3s *r2,long N)

{
  long in_RDX;
  long i;
  mrg3s *this;
  
  for (this = (mrg3s *)0x0; (long)this < in_RDX; this = (mrg3s *)((long)(this->P).a + 1)) {
    trng::mrg3s::operator()(this);
    trng::mrg3s::operator()(this);
  }
  return;
}

Assistant:

void advance_engine(R &r1, R &r2, const long N) {
  for (long i{0}; i < N; ++i) {
    r1();
    r2();
  }
}